

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccallback.c
# Opt level: O0

MSize lj_ccallback_ptr2slot(CTState *cts,void *p)

{
  ulong uVar1;
  MSize ofs_00;
  MSize slot;
  uintptr_t ofs;
  void *p_local;
  CTState *cts_local;
  
  uVar1 = (long)p - (long)(cts->cb).mcode;
  if ((0xfff < uVar1) ||
     (ofs_00 = (MSize)uVar1, cts_local._4_4_ = CALLBACK_OFS2SLOT(ofs_00),
     (cts_local._4_4_ >> 5) * 0x11 + 8 + cts_local._4_4_ * 4 != ofs_00)) {
    cts_local._4_4_ = 0xffffffff;
  }
  return cts_local._4_4_;
}

Assistant:

MSize lj_ccallback_ptr2slot(CTState *cts, void *p)
{
  uintptr_t ofs = (uintptr_t)((uint8_t *)p -(uint8_t *)cts->cb.mcode);
  if (ofs < CALLBACK_MCODE_SIZE) {
    MSize slot = CALLBACK_OFS2SLOT((MSize)ofs);
    if (CALLBACK_SLOT2OFS(slot) == (MSize)ofs)
      return slot;
  }
  return ~0u;  /* Not a known callback function pointer. */
}